

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O0

void * funchook_resolve_func(funchook_t *funchook,void *func)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  void *in_RSI;
  funchook_t *in_RDI;
  void *fn;
  int i;
  size_t strtab_size;
  char *strtab;
  Elf64_Sym *symtab_end;
  Elf64_Sym *symtab;
  Elf64_Dyn *dyn;
  Elf64_Ehdr *ehdr;
  link_map *lm;
  link_map *lmap;
  void *local_68;
  int local_5c;
  ulong local_58;
  uint *local_50;
  uint *local_40;
  ulong *local_28;
  ulong *local_20;
  void *local_18;
  
  local_40 = (uint *)0x0;
  local_50 = (uint *)0x0;
  local_58 = 0;
  local_20 = (ulong *)0x0;
  for (local_28 = _mmap; local_28 != (ulong *)0x0; local_28 = (ulong *)local_28[3]) {
    if ((void *)*local_28 <= in_RSI) {
      if (local_20 == (ulong *)0x0) {
        local_20 = local_28;
      }
      else if (*local_28 < *local_20) {
        local_20 = local_28;
      }
    }
  }
  if (local_20 == (ulong *)0x0) {
    return in_RSI;
  }
  if (*local_20 != 0) {
    piVar1 = (int *)*local_20;
    if (*piVar1 != 0x464c457f) {
      funchook_log(in_RDI,"  not a valid ELF module %s.\n",local_20[1]);
      return in_RSI;
    }
    if (((short)piVar1[4] != 2) && ((short)piVar1[4] != 3)) {
      funchook_log(in_RDI,"  ELF type is neither ET_EXEC nor ET_DYN.\n");
      return in_RSI;
    }
  }
  funchook_log(in_RDI,"  link_map addr=%p, name=%s\n",*local_20,local_20[1]);
  uVar2 = local_20[2];
  local_5c = 0;
  while (*(long *)(uVar2 + (long)local_5c * 0x10) != 0) {
    lVar3 = *(long *)(uVar2 + (long)local_5c * 0x10);
    if (lVar3 == 5) {
      local_50 = *(uint **)(uVar2 + (long)local_5c * 0x10 + 8);
    }
    else if (lVar3 == 6) {
      local_40 = *(uint **)(uVar2 + (long)local_5c * 0x10 + 8);
    }
    else if (lVar3 == 10) {
      local_58 = *(ulong *)(uVar2 + (long)local_5c * 0x10 + 8);
    }
    local_5c = local_5c + 1;
  }
  while( true ) {
    if (local_50 <= local_40) {
      return in_RSI;
    }
    if (local_58 <= *local_40) break;
    if ((((local_40[1] & 0xf) == 2) && (*(long *)(local_40 + 4) == 0)) &&
       (*(void **)(local_40 + 2) == in_RSI)) {
      local_68 = (void *)dlsym(0,(long)local_50 + (ulong)*local_40);
      if (local_68 == in_RSI) {
        local_68 = (void *)dlsym(0xffffffffffffffff,(long)local_50 + (ulong)*local_40);
      }
      local_18 = in_RSI;
      if (local_68 != (void *)0x0) {
        funchook_log(in_RDI,"  change %s address from %p to %p\n",(long)local_50 + (ulong)*local_40,
                     in_RSI,local_68);
        local_18 = local_68;
      }
      return local_18;
    }
    local_40 = local_40 + 6;
  }
  return in_RSI;
}

Assistant:

void *funchook_resolve_func(funchook_t *funchook, void *func)
{
#ifdef __GLIBC__
    struct link_map *lmap, *lm;
    const ElfW(Ehdr) *ehdr;
    const ElfW(Dyn) *dyn;
    const ElfW(Sym) *symtab = NULL;
    const ElfW(Sym) *symtab_end = NULL;
    const char *strtab = NULL;
    size_t strtab_size = 0;
    int i;

    lmap = NULL;
    for (lm = _r_debug.r_map; lm != NULL; lm = lm->l_next) {
        if ((void*)lm->l_addr <= func) {
            if (lmap == NULL) {
                lmap = lm;
            } else if (lmap->l_addr > lm->l_addr) {
                lmap = lm;
            }
        }
    }
    if (lmap == NULL) {
        return func;
    }
    if (lmap->l_addr != 0) {
        ehdr = (ElfW(Ehdr) *)lmap->l_addr;
        if (memcmp(ehdr->e_ident, ELFMAG, SELFMAG) != 0) {
            funchook_log(funchook, "  not a valid ELF module %s.\n", lmap->l_name);
            return func;
        }
        if (ehdr->e_type != ET_EXEC && ehdr->e_type != ET_DYN) {
          funchook_log(funchook, "  ELF type is neither ET_EXEC nor ET_DYN.\n");
          return func;
        }
    }
    funchook_log(funchook, "  link_map addr=%p, name=%s\n", (void*)lmap->l_addr, lmap->l_name);
    dyn = lmap->l_ld;

    for (i = 0; dyn[i].d_tag != DT_NULL; i++) {
        switch (dyn[i].d_tag) {
        case DT_SYMTAB:
            symtab = (const ElfW(Sym) *)dyn[i].d_un.d_ptr;
            break;
        case DT_STRTAB:
            strtab = (const char *)dyn[i].d_un.d_ptr;
            break;
        case DT_STRSZ:
            strtab_size = dyn[i].d_un.d_val;
            break;
        }
    }
    symtab_end = (const ElfW(Sym) *)strtab;
    while (symtab < symtab_end) {
        if (symtab->st_name >= strtab_size) {
            break;
        }
        if (ELF64_ST_TYPE(symtab->st_info) == STT_FUNC &&
            symtab->st_size == 0 && (void*)symtab->st_value == func) {
            void *fn = dlsym(RTLD_DEFAULT, strtab + symtab->st_name);
            if (fn == func) {
                fn = dlsym(RTLD_NEXT, strtab + symtab->st_name);
            }
            if (fn != NULL) {
                funchook_log(funchook, "  change %s address from %p to %p\n",
                             strtab + symtab->st_name, func, fn);
                func = fn;
            }
            break;
        }
        symtab++;
    }
#endif
    return func;
}